

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O3

int Res_WinCollectLeavesAndNodes(Res_Win_t *p)

{
  int iVar1;
  Vec_Vec_t *p_00;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  void *pvVar4;
  long *plVar5;
  long *Entry;
  long lVar6;
  long lVar7;
  bool bVar8;
  int *__s;
  void **ppvVar9;
  uint uVar10;
  int i;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  ulong uVar11;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar12;
  Vec_Ptr_t *pVVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  
  if (p->nWinTfiMax < 1) {
    __assert_fail("p->nWinTfiMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x6a,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
  }
  p_00 = p->vMatrix;
  uVar10 = p_00->nSize;
  if ((int)uVar10 <= p->nWinTfiMax) {
    __assert_fail("Vec_VecSize(p->vMatrix) > p->nWinTfiMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x6b,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
  }
  ppvVar9 = p_00->pArray;
  uVar11 = 0;
  do {
    *(undefined4 *)((long)ppvVar9[uVar11] + 4) = 0;
    uVar11 = uVar11 + 1;
  } while (uVar10 != uVar11);
  Vec_VecPush(p_00,0,p->pNode);
  pAVar2 = p->pNode;
  pAVar3 = pAVar2->pNtk;
  iVar14 = extraout_EDX;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar1 = pAVar3->vObjs->nSize;
    uVar11 = (long)iVar1 + 500;
    iVar17 = (int)uVar11;
    if ((pAVar3->vTravIds).nCap < iVar17) {
      __s = (int *)malloc(uVar11 * 4);
      (pAVar3->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar17;
      iVar14 = extraout_EDX_00;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(__s,0,(uVar11 & 0xffffffff) << 2);
      iVar14 = extraout_EDX_01;
    }
    (pAVar3->vTravIds).nSize = iVar17;
  }
  iVar17 = pAVar3->nTravIds;
  iVar1 = iVar17 + 1;
  pAVar3->nTravIds = iVar1;
  if (0x3ffffffe < iVar17) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  iVar17 = pAVar2->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar17 + 1,iVar14);
  if (((long)iVar17 < 0) || ((pAVar3->vTravIds).nSize <= iVar17)) {
LAB_0046e0dc:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar17] = iVar1;
  p->vLeaves->nSize = 0;
  uVar10 = p->nWinTfiMax;
  if (-1 < (int)uVar10) {
    lVar18 = 0;
    do {
      if (p->vMatrix->nSize <= lVar18) goto LAB_0046e0fb;
      pvVar4 = p->vMatrix->pArray[lVar18];
      iVar14 = *(int *)((long)pvVar4 + 4);
      if (0 < iVar14) {
        lVar15 = 0;
        do {
          plVar5 = *(long **)(*(long *)((long)pvVar4 + 8) + lVar15 * 8);
          if (0 < *(int *)((long)plVar5 + 0x1c)) {
            lVar19 = 0;
            pvVar12 = pvVar4;
            do {
              Entry = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                (long)*(int *)(plVar5[4] + lVar19 * 4) * 8);
              lVar6 = *Entry;
              iVar14 = (int)Entry[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar14 + 1,(int)pvVar12);
              if (((long)iVar14 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar14)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              lVar7 = *Entry;
              iVar1 = *(int *)(lVar7 + 0xd8);
              pvVar12 = extraout_RDX;
              if (*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar14 * 4) != iVar1) {
                iVar14 = (int)Entry[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar14 + 1,(int)extraout_RDX);
                if (((long)iVar14 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar14)) goto LAB_0046e0dc;
                *(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar14 * 4) = iVar1;
                uVar10 = *(uint *)((long)Entry + 0x14) & 0xf;
                if (((uVar10 == 2) || (uVar10 == 5)) ||
                   (iVar14 = (*(uint *)&p->pNode->field_0x14 >> 0xc) -
                             (*(uint *)((long)Entry + 0x14) >> 0xc), p->nWinTfiMax < iVar14)) {
                  pVVar13 = p->vLeaves;
                  uVar10 = pVVar13->nSize;
                  if (uVar10 == pVVar13->nCap) {
                    if ((int)uVar10 < 0x10) {
                      if (pVVar13->pArray == (void **)0x0) {
                        ppvVar9 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar9 = (void **)realloc(pVVar13->pArray,0x80);
                      }
                      pVVar13->pArray = ppvVar9;
                      pVVar13->nCap = 0x10;
                    }
                    else {
                      if (pVVar13->pArray == (void **)0x0) {
                        ppvVar9 = (void **)malloc((ulong)uVar10 << 4);
                      }
                      else {
                        ppvVar9 = (void **)realloc(pVVar13->pArray,(ulong)uVar10 << 4);
                      }
                      pVVar13->pArray = ppvVar9;
                      pVVar13->nCap = uVar10 * 2;
                    }
                  }
                  else {
                    ppvVar9 = pVVar13->pArray;
                  }
                  iVar14 = pVVar13->nSize;
                  uVar10 = iVar14 + 1;
                  pvVar12 = (void *)(ulong)uVar10;
                  pVVar13->nSize = uVar10;
                  ppvVar9[iVar14] = Entry;
                }
                else {
                  Vec_VecPush(p->vMatrix,iVar14,Entry);
                  pvVar12 = extraout_RDX_00;
                }
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < *(int *)((long)plVar5 + 0x1c));
            iVar14 = *(int *)((long)pvVar4 + 4);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar14);
        uVar10 = p->nWinTfiMax;
      }
      bVar8 = lVar18 < (int)uVar10;
      lVar18 = lVar18 + 1;
    } while (bVar8);
    pVVar13 = p->vLeaves;
    if (pVVar13->nSize != 0) {
      p->vNodes->nSize = 0;
      if (-1 < (int)uVar10) {
        uVar11 = (ulong)uVar10;
        do {
          if ((long)p->vMatrix->nSize <= (long)uVar11) {
LAB_0046e0fb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          pvVar4 = p->vMatrix->pArray[uVar11];
          if (0 < *(int *)((long)pvVar4 + 4)) {
            lVar18 = 0;
            do {
              pvVar12 = *(void **)(*(long *)((long)pvVar4 + 8) + lVar18 * 8);
              pVVar13 = p->vNodes;
              uVar10 = pVVar13->nSize;
              if (uVar10 == pVVar13->nCap) {
                if ((int)uVar10 < 0x10) {
                  if (pVVar13->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar13->pArray,0x80);
                  }
                  pVVar13->pArray = ppvVar9;
                  pVVar13->nCap = 0x10;
                }
                else {
                  if (pVVar13->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar10 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar13->pArray,(ulong)uVar10 << 4);
                  }
                  pVVar13->pArray = ppvVar9;
                  pVVar13->nCap = uVar10 * 2;
                }
              }
              else {
                ppvVar9 = pVVar13->pArray;
              }
              iVar14 = pVVar13->nSize;
              pVVar13->nSize = iVar14 + 1;
              ppvVar9[iVar14] = pvVar12;
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)pvVar4 + 4));
          }
          *(undefined4 *)((long)pvVar4 + 4) = 0;
          bVar8 = 0 < (long)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar8);
        pVVar13 = p->vLeaves;
      }
      p->nLevLeafMin = 1000000000;
      iVar14 = pVVar13->nSize;
      if ((long)iVar14 < 1) {
        uVar10 = 1000000000;
      }
      else {
        ppvVar9 = pVVar13->pArray;
        uVar10 = 1000000000;
        lVar18 = 0;
        do {
          uVar16 = *(uint *)((long)ppvVar9[lVar18] + 0x14) >> 0xc;
          if (uVar16 <= uVar10) {
            uVar10 = uVar16;
          }
          p->nLevLeafMin = uVar10;
          lVar18 = lVar18 + 1;
        } while (iVar14 != lVar18);
      }
      uVar16 = (*(uint *)&p->pNode->field_0x14 >> 0xc) - (p->nWinTfiMax + p->nLevTfiMinus);
      if ((int)uVar16 <= (int)uVar10) {
        uVar16 = uVar10;
      }
      p->nLevTravMin = uVar16;
      return 1;
    }
  }
  return 0;
}

Assistant:

int Res_WinCollectLeavesAndNodes( Res_Win_t * p )
{
    Vec_Ptr_t * vFront;
    Abc_Obj_t * pObj, * pTemp;
    int i, k, m;

    assert( p->nWinTfiMax > 0 );
    assert( Vec_VecSize(p->vMatrix) > p->nWinTfiMax );

    // start matrix with the node
    Vec_VecClear( p->vMatrix );
    Vec_VecPush( p->vMatrix, 0, p->pNode );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Abc_NodeSetTravIdCurrent( p->pNode );

    // collect the leaves (nodes pTemp such that "p->pNode->Level - pTemp->Level > p->nWinTfiMax")
    Vec_PtrClear( p->vLeaves );
    Vec_VecForEachLevelStartStop( p->vMatrix, vFront, i, 0, p->nWinTfiMax+1 )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, k )
        {
            Abc_ObjForEachFanin( pObj, pTemp, m )
            {
                if ( Abc_NodeIsTravIdCurrent( pTemp ) )
                    continue;
                Abc_NodeSetTravIdCurrent( pTemp );
                if ( Abc_ObjIsCi(pTemp) || (int)(p->pNode->Level - pTemp->Level) > p->nWinTfiMax )                    
                    Vec_PtrPush( p->vLeaves, pTemp );
                else
                    Vec_VecPush( p->vMatrix, p->pNode->Level - pTemp->Level, pTemp );
            }
        }
    }
    if ( Vec_PtrSize(p->vLeaves) == 0 )
        return 0;

    // collect the nodes in the reverse order
    Vec_PtrClear( p->vNodes );
    Vec_VecForEachLevelReverseStartStop( p->vMatrix, vFront, i, p->nWinTfiMax+1, 0 )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, k )
            Vec_PtrPush( p->vNodes, pObj );
        Vec_PtrClear( vFront );
    }

    // get the lowest leaf level
    p->nLevLeafMin = ABC_INFINITY;
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, k )
        p->nLevLeafMin = Abc_MinInt( p->nLevLeafMin, (int)pObj->Level );

    // set minimum traversal level
    p->nLevTravMin = Abc_MaxInt( ((int)p->pNode->Level) - p->nWinTfiMax - p->nLevTfiMinus, p->nLevLeafMin );
    assert( p->nLevTravMin >= 0 );
    return 1;
}